

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O1

void time_map_fetch<EasyUseHashMap<HashObject<256,32>,int,HashFn>>
               (int iters,vector<int,_std::allocator<int>_> *indices,char *title)

{
  mapped_type *pmVar1;
  long lVar2;
  iterator iVar3;
  long lVar4;
  size_t in_RCX;
  size_t start_memory;
  int __c;
  uint __seed;
  ulong uVar5;
  EasyUseHashMap<HashObject<256,_32>,_int,_HashFn> set;
  _Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_168;
  key_type local_130;
  
  local_168._M_buckets = &local_168._M_single_bucket;
  local_168._M_bucket_count = 1;
  local_168._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_168._M_element_count = 0;
  local_168._M_rehash_policy._M_max_load_factor = 1.0;
  local_168._M_rehash_policy._M_next_resize = 0;
  local_168._M_single_bucket = (__node_base_ptr)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < iters) {
    __c = 0;
    do {
      local_130.i_ = __c;
      memset(local_130.buffer_,__c,0xfc);
      pmVar1 = std::__detail::
               _Map_base<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&local_168,&local_130);
      __c = __c + 1;
      *pmVar1 = __c;
    } while (iters != __c);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar2 = std::chrono::_V2::steady_clock::now();
  if (iters < 1) {
    __seed = 1;
  }
  else {
    __seed = 1;
    uVar5 = 0;
    do {
      local_130.i_ = (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar5];
      memset(local_130.buffer_,local_130.i_,0xfc);
      iVar3 = std::
              _Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&local_168,&local_130);
      in_RCX = (size_t)(iVar3.
                        super__Node_iterator_base<std::pair<const_HashObject<256,_32>,_int>,_true>.
                        _M_cur != (__node_type *)0x0);
      __seed = __seed ^ iVar3.
                        super__Node_iterator_base<std::pair<const_HashObject<256,_32>,_int>,_true>.
                        _M_cur != (__node_type *)0x0;
      uVar5 = uVar5 + 1;
    } while ((uint)iters != uVar5);
  }
  lVar4 = std::chrono::_V2::steady_clock::now();
  srand(__seed);
  report(title,(double)(lVar4 - lVar2),iters,start_memory,in_RCX);
  std::
  _Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_168);
  return;
}

Assistant:

static void time_map_fetch(int iters, const vector<int>& indices,
                           char const* title) {
  MapType set;
  Rusage t;
  int r;
  int i;

  for (i = 0; i < iters; i++) {
    set[i] = i + 1;
  }

  r = 1;
  t.Reset();
  for (i = 0; i < iters; i++) {
    r ^= static_cast<int>(set.find(indices[i]) != set.end());
  }
  double ut = t.UserTime();

  srand(r);  // keep compiler from optimizing away r (we never call rand())
  report(title, ut, iters, 0, 0);
}